

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O3

void __thiscall QTabWidget::setTabsClosable(QTabWidget *this,bool closeable)

{
  QObject *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  Connection CStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QTabBar::tabsClosable(*(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600));
  if (bVar2 != closeable) {
    QTabBar::setTabsClosable
              (*(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600),closeable);
    pQVar1 = *(QObject **)(*(long *)&(this->super_QWidget).field_0x8 + 600);
    if (closeable) {
      QObject::connect((QObject *)&CStack_28,(char *)pQVar1,(QObject *)"2tabCloseRequested(int)",
                       (char *)this,0x6da5da);
      QMetaObject::Connection::~Connection(&CStack_28);
    }
    else {
      QObject::disconnect(pQVar1,"2tabCloseRequested(int)",(QObject *)this,"2tabCloseRequested(int)"
                         );
    }
    setUpLayout(this,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabWidget::setTabsClosable(bool closeable)
{
    if (tabsClosable() == closeable)
        return;

    tabBar()->setTabsClosable(closeable);
    if (closeable)
        connect(tabBar(), SIGNAL(tabCloseRequested(int)),
                this, SIGNAL(tabCloseRequested(int)));
    else
        disconnect(tabBar(), SIGNAL(tabCloseRequested(int)),
                  this, SIGNAL(tabCloseRequested(int)));
    setUpLayout();
}